

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setupTest.cpp
# Opt level: O0

void __thiscall Setup_Boundary_Test::Setup_Boundary_Test(Setup_Boundary_Test *this)

{
  Setup_Boundary_Test *this_local;
  
  Setup::Setup(&this->super_Setup);
  (this->super_Setup).super_Test._vptr_Test = (_func_int **)&PTR__Setup_Boundary_Test_00180b30;
  return;
}

Assistant:

TEST_F(Setup, Boundary)
{
	REAL **U = nullptr, **V = nullptr, **P = nullptr;
	REAL init[3] = {1.0,1.0,1.0};
	initFlags("Step",bCond.FLAG,&grid,Region);
	int ib = grid.imax/2-grid.il, jb = grid.jmax/2-grid.jb;
	if (ib > grid.deli)
		ib = grid.deli;
	if (jb > grid.delj)
		jb = grid.delj;
	ASSERT_TRUE(cmpFlags(bCond.FLAG,ib,jb));
	initUVP(&U,&V,&P,grid.imax,grid.jmax,init);

	setBCond(U,V,&grid,&bCond);
	setSpecBCond(U,V,&grid,"Step");
	applyPbndCond(P,&grid,bCond.FLAG);
/*
	print2Dfield(U,grid.deli+3,grid.delj+2);
	print2Dfield(V,grid.deli+2,grid.delj+3);
	print2Dfield(P,grid.deli+2,grid.delj+2);
*/
	destroy2Dfield((void**)U,grid.deli+3);
	destroy2Dfield((void**)V,grid.deli+2);
	destroy2Dfield((void**)P,grid.deli+2);
}